

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

int longestLine(string *input)

{
  wchar_t ucs;
  int iVar1;
  size_type sStack_20;
  int character;
  size_type i;
  int length;
  int longest;
  string *input_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  sStack_20 = 0;
  _length = input;
  while (ucs = utf8_next_char(_length,&stack0xffffffffffffffe0), ucs != L'\0') {
    if (ucs == L'\n') {
      if (i._4_4_ < (int)i) {
        i._4_4_ = (int)i;
      }
      i._0_4_ = 0;
    }
    else {
      iVar1 = mk_wcwidth(ucs);
      i._0_4_ = iVar1 + (int)i;
    }
  }
  if (i._4_4_ < (int)i) {
    i._4_4_ = (int)i;
  }
  return i._4_4_;
}

Assistant:

int longestLine (const std::string& input)
{
  int longest = 0;
  int length = 0;
  std::string::size_type i = 0;
  int character;

  while ((character = utf8_next_char (input, i)))
  {
    if (character == '\n')
    {
      if (length > longest)
        longest = length;

      length = 0;
    }
    else
      length += mk_wcwidth (character);
  }

  if (length > longest)
    longest = length;

  return longest;
}